

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall choc::value::Value::Value(Value *this,string_view s)

{
  uint32_t *puVar1;
  Handle HVar2;
  Type local_40;
  
  local_40.mainType = string;
  local_40.content.object = (Object *)0x0;
  local_40.allocator = (Allocator *)0x0;
  Value(this,&local_40);
  Type::deleteAllocatedObjects(&local_40);
  puVar1 = (uint32_t *)(this->value).data;
  HVar2 = SimpleStringDictionary::getHandleForString(&this->dictionary,s);
  *puVar1 = HVar2.handle;
  return;
}

Assistant:

inline Value::Value (std::string_view s)  : Value (Type::createString())   { writeUnaligned (value.data, dictionary.getHandleForString (s)); }